

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

bool flatbuffers::StringToNumber<unsigned_char>(char *s,uchar *val)

{
  bool bVar1;
  int64_t min;
  int64_t max;
  int64_t i64;
  uchar *val_local;
  char *s_local;
  
  i64 = (int64_t)val;
  val_local = (uchar *)s;
  if (s == (char *)0x0 || val == (uchar *)0x0) {
    __assert_fail("s && val",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                  ,0x14b,"bool flatbuffers::StringToNumber(const char *, T *) [T = unsigned char]");
  }
  bVar1 = StringToIntegerImpl<long>(&max,s,0,false);
  if (bVar1) {
    if (max < 0x100) {
      if (max < 0) {
        *(undefined1 *)i64 = 0xff;
        s_local._7_1_ = false;
      }
      else {
        *(char *)i64 = (char)max;
        s_local._7_1_ = true;
      }
    }
    else {
      *(undefined1 *)i64 = 0xff;
      s_local._7_1_ = false;
    }
  }
  else {
    *(undefined1 *)i64 = 0;
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

inline bool StringToNumber(const char *s, T *val) {
  // Assert on `unsigned long` and `signed long` on LP64.
  // If it is necessary, it could be solved with flatbuffers::enable_if<B,T>.
  static_assert(sizeof(T) < sizeof(int64_t), "unexpected type T");
  FLATBUFFERS_ASSERT(s && val);
  int64_t i64;
  // The errno check isn't needed, will return MAX/MIN on overflow.
  if (StringToIntegerImpl(&i64, s, 0, false)) {
    const int64_t max = (flatbuffers::numeric_limits<T>::max)();
    const int64_t min = flatbuffers::numeric_limits<T>::lowest();
    if (i64 > max) {
      *val = static_cast<T>(max);
      return false;
    }
    if (i64 < min) {
      // For unsigned types return max to distinguish from
      // "no conversion can be performed" when 0 is returned.
      *val = static_cast<T>(flatbuffers::is_unsigned<T>::value ? max : min);
      return false;
    }
    *val = static_cast<T>(i64);
    return true;
  }
  *val = 0;
  return false;
}